

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.h
# Opt level: O0

uchar * __thiscall
CCharmapToLocal::get_xlation(CCharmapToLocal *this,wchar_t unicode_char,size_t *map_len)

{
  uint ofs;
  byte *pbVar1;
  CCharmapToLocal *in_RDX;
  CCharmapToLocal *in_RDI;
  uchar *map;
  undefined8 in_stack_ffffffffffffffe0;
  
  ofs = get_mapping(in_RDX,(wchar_t)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  pbVar1 = get_xlat_ptr(in_RDI,ofs);
  (in_RDX->super_CCharmap)._vptr_CCharmap = (_func_int **)(ulong)*pbVar1;
  return pbVar1 + 1;
}

Assistant:

const unsigned char *get_xlation(wchar_t unicode_char, size_t *map_len)
        const
    {
        const unsigned char *map;

        /* get the translation offset */
        map = get_xlat_ptr(get_mapping(unicode_char));

        /* read the length and skip it in the table */
        *map_len = (size_t)*map++;

        /* return the mapped byte sequence */
        return map;
    }